

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TinyRender.cpp
# Opt level: O1

void __thiscall TRM::TinyRender::triangle(TinyRender *this,Vec3f *pts,TGAColor *colors)

{
  float *pfVar1;
  vec<3,_float,_(glm::qualifier)0> A;
  int iVar2;
  int iVar3;
  int i;
  long lVar4;
  int j;
  int iVar5;
  Vec3f *pVVar6;
  int iVar7;
  float fVar8;
  anon_union_4_3_4e90b0ec_for_vec<3,_float,_(glm::qualifier)0>_5 aVar9;
  undefined4 extraout_XMM0_Dc;
  undefined4 extraout_XMM0_Dc_00;
  undefined4 extraout_XMM0_Dd;
  undefined4 extraout_XMM0_Dd_00;
  anon_union_4_3_4e909dac_for_vec<3,_float,_(glm::qualifier)0>_7 aVar10;
  anon_union_4_3_4e909dac_for_vec<3,_float,_(glm::qualifier)0>_7 aVar11;
  float fVar12;
  Vec3f VVar13;
  vec<3,_float,_(glm::qualifier)0> P;
  TGAColor c;
  TGAColor local_a0;
  float local_98;
  float local_94;
  anon_union_4_3_4e909dac_for_vec<3,_float,_(glm::qualifier)0>_7 local_90;
  float local_8c;
  anon_union_4_3_4e909dac_for_vec<3,_float,_(glm::qualifier)0>_7 local_88;
  undefined4 uStack_84;
  undefined4 uStack_80;
  undefined4 uStack_7c;
  undefined1 local_78 [16];
  anon_union_4_3_4e909dac_for_vec<3,_float,_(glm::qualifier)0>_7 local_68;
  anon_union_4_3_4e909dac_for_vec<3,_float,_(glm::qualifier)0>_7 aStack_64;
  undefined4 uStack_60;
  undefined4 uStack_5c;
  anon_union_4_3_4e90b0ec_for_vec<3,_float,_(glm::qualifier)0>_5 local_58;
  anon_union_4_3_4e90b0ec_for_vec<3,_float,_(glm::qualifier)0>_5 aStack_54;
  anon_union_4_3_4e90b0ec_for_vec<3,_float,_(glm::qualifier)0>_5 aStack_50;
  anon_union_4_3_4e90b0ec_for_vec<3,_float,_(glm::qualifier)0>_5 aStack_4c;
  undefined1 local_48 [16];
  
  TGAImage::get_width(this->mImage);
  iVar2 = TGAImage::get_width(this->mImage);
  iVar3 = TGAImage::get_height(this->mImage);
  local_88.z = (float)(iVar2 + -1);
  local_78 = ZEXT416((uint)(float)(iVar3 + -1));
  uStack_80 = extraout_XMM0_Dc;
  uStack_7c = extraout_XMM0_Dd;
  iVar2 = TGAImage::get_width(this->mImage);
  iVar3 = TGAImage::get_height(this->mImage);
  lVar4 = 0;
  local_94 = 0.0;
  local_8c = 0.0;
  do {
    iVar5 = 0;
    fVar8 = local_8c;
    local_68 = local_88;
    do {
      pVVar6 = (Vec3f *)&pts[lVar4].field_2;
      if ((iVar5 != 2) && (pVVar6 = pts + lVar4, iVar5 == 1)) {
        pVVar6 = (Vec3f *)&pts[lVar4].field_1;
      }
      aVar11 = (anon_union_4_3_4e909dac_for_vec<3,_float,_(glm::qualifier)0>_7)local_78._0_4_;
      if (iVar5 != 1) {
        aVar11 = local_68;
      }
      aVar10.z = (pVVar6->field_0).x;
      if (aVar11.z <= (pVVar6->field_0).x) {
        aVar10 = aVar11;
      }
      if (aVar10.z <= 0.0) {
        aVar10.z = 0.0;
      }
      if (iVar5 == 1) {
        local_78._4_4_ = 0;
        local_78._8_4_ = 0;
        local_78._12_4_ = 0;
        local_78._0_4_ = aVar10;
      }
      else {
        uStack_80 = 0;
        uStack_7c = 0;
        local_68 = aVar10;
      }
      pVVar6 = (Vec3f *)&pts[lVar4].field_2;
      if ((iVar5 != 2) && (pVVar6 = pts + lVar4, iVar5 == 1)) {
        pVVar6 = (Vec3f *)&pts[lVar4].field_1;
      }
      iVar7 = iVar2;
      if (iVar5 == 1) {
        iVar7 = iVar3;
      }
      fVar12 = fVar8;
      if (iVar5 != 1) {
        fVar12 = local_94;
      }
      local_8c = (pVVar6->field_0).x;
      if ((pVVar6->field_0).x <= fVar12) {
        local_8c = fVar12;
      }
      if ((float)(iVar7 + -1) <= local_8c) {
        local_8c = (float)(iVar7 + -1);
      }
      if (iVar5 != 1) {
        local_94 = local_8c;
        local_8c = fVar8;
      }
      iVar5 = iVar5 + 1;
      fVar8 = local_8c;
    } while (iVar5 == 1);
    lVar4 = lVar4 + 1;
    local_88 = local_68;
  } while (lVar4 != 3);
  if (local_68.z <= local_94) {
    uStack_60 = uStack_80;
    uStack_5c = uStack_7c;
    do {
      local_88 = (anon_union_4_3_4e909dac_for_vec<3,_float,_(glm::qualifier)0>_7)local_78._0_4_;
      uStack_84 = local_78._4_4_;
      uStack_80 = local_78._8_4_;
      uStack_7c = local_78._12_4_;
      if ((float)local_78._0_4_ <= local_8c) {
        do {
          A.field_0 = pts->field_0;
          A.field_1 = pts->field_1;
          A.field_2 = pts->field_2;
          P.field_1.y = local_88.z;
          P.field_0.x = local_68.z;
          P.field_2.z = local_68.z;
          aStack_64 = local_88;
          VVar13 = barycentric<3ul>(A,pts[1],pts[2],P);
          aVar11 = VVar13.field_2;
          aVar9 = VVar13.field_1;
          if (((0.0 <= VVar13.field_0.x) && (0.0 <= aVar9.y)) && (0.0 <= aVar11.z)) {
            local_98 = pts[2].field_2.z * aVar11.z +
                       (pts->field_2).z * VVar13.field_0.x + pts[1].field_2.z * aVar9.y;
            pfVar1 = this->mZBuffer;
            local_48._8_4_ = extraout_XMM0_Dc_00;
            local_48._0_8_ = VVar13._0_8_;
            local_48._12_4_ = extraout_XMM0_Dd_00;
            local_90 = aVar11;
            local_58 = aVar9;
            aStack_54 = aVar9;
            aStack_50 = aVar9;
            aStack_4c = aVar9;
            iVar2 = TGAImage::get_width(this->mImage);
            if (local_98 < pfVar1[(int)((float)iVar2 * local_88.z + local_68.z)] ||
                local_98 == pfVar1[(int)((float)iVar2 * local_88.z + local_68.z)]) {
              pfVar1 = this->mZBuffer;
              iVar2 = TGAImage::get_width(this->mImage);
              pfVar1[(int)((float)iVar2 * local_88.z + local_68.z)] = local_98;
              local_a0.bytespp = '\x01';
              local_a0.bgra[1] =
                   (uchar)(int)((float)colors[2].bgra[1] * local_90.z +
                               (float)colors->bgra[1] * (float)local_48._0_4_ +
                               (float)colors[1].bgra[1] * local_58.y);
              local_a0.bgra[0] =
                   (uchar)(int)((float)colors[2].bgra[0] * local_90.z +
                               (float)colors->bgra[0] * (float)local_48._0_4_ +
                               (float)colors[1].bgra[0] * local_58.y);
              local_a0.bgra[2] =
                   (char)(int)((float)colors[2].bgra[2] * local_90.z +
                              (float)colors->bgra[2] * (float)local_48._0_4_ +
                              (float)colors[1].bgra[2] * local_58.y);
              local_a0.bgra[3] = '\0';
              TGAImage::set(this->mImage,(int)local_68.z,(int)local_88.z,&local_a0);
            }
          }
          local_88.z = local_88.z + 1.0;
        } while (local_88.z <= local_8c);
      }
      fVar8 = local_68.z + 1.0;
      local_68.z = local_68.z + 1.0;
    } while (fVar8 <= local_94);
  }
  return;
}

Assistant:

void TinyRender::triangle(Vec3f* pts, TGAColor* colors) {
  int width = mImage->get_width();

  Vec2i ptis[3];
  for (size_t i = 0; i < 3; i++) {
    ptis[i][0] = int(pts[i][0] + .5f);
    ptis[i][1] = int(pts[i][1] + .5f);
  }

  Vec2f bboxmin(this->mImage->get_width() - 1, this->mImage->get_height() - 1);
  Vec2f bboxmax(0, 0);
  Vec2f clamp(this->mImage->get_width() - 1, this->mImage->get_height() - 1);
  for (int i = 0; i < 3; i++) {
    for (int j = 0; j < 2; j++) {
      bboxmin[j] = std::max(0.f, std::min(bboxmin[j], pts[i][j]));
      bboxmax[j] = std::min(clamp[j], std::max(bboxmax[j], pts[i][j]));
    }
  }

  Vec3f p;
  for (p[0] = bboxmin.x; p[0] <= bboxmax.x; p[0]++) {
    for (p[1] = bboxmin.y; p[1] <= bboxmax.y; p[1]++) {
      Vec3f bc_screen = barycentric<3>(pts[0], pts[1], pts[2], p);
      if (bc_screen[0] < 0 || bc_screen[1] < 0 || bc_screen[2] < 0) continue;

      float pz = pts[0][2] * bc_screen[0] + pts[1][2] * bc_screen[1] +
                 pts[2][2] * bc_screen[2];

      if (mZBuffer[int(p.x + p.y * mImage->get_width())] < pz) continue;

      mZBuffer[int(p.x + p.y * mImage->get_width())] = pz;

      TGAColor c;
      /*
          barycentric result can also interpolation Color
      */
      c.bgra[0] = bc_screen[0] * colors[0].bgra[0] +
                  bc_screen[1] * colors[1].bgra[0] +
                  bc_screen[2] * colors[2].bgra[0];
      c.bgra[1] = bc_screen[0] * colors[0].bgra[1] +
                  bc_screen[1] * colors[1].bgra[1] +
                  bc_screen[2] * colors[2].bgra[1];
      c.bgra[2] = bc_screen[0] * colors[0].bgra[2] +
                  bc_screen[1] * colors[1].bgra[2] +
                  bc_screen[2] * colors[2].bgra[2];

      mImage->set(p[0], p[1], c);
    }
  }
}